

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

void __thiscall
dg::vr::RelationsAnalyzer::opGen(RelationsAnalyzer *this,ValueRelations *graph,BinaryOperator *op)

{
  BinaryOps BVar1;
  ret_type pCVar2;
  ret_type pCVar3;
  undefined8 in_RDX;
  ValueRelations *in_RSI;
  ValueRelations *in_RDI;
  BinaryOps opcode;
  ConstantInt *c2;
  ConstantInt *c1;
  BinaryOperator *in_stack_000000a0;
  ValueRelations *in_stack_000000a8;
  RelationsAnalyzer *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  BinaryOps opcode_00;
  
  opcode_00 = (BinaryOps)((ulong)in_RDX >> 0x20);
  llvm::BinaryOperator::getOperand
            ((BinaryOperator *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (uint)((ulong)in_RDI >> 0x20));
  pCVar2 = llvm::dyn_cast<llvm::ConstantInt,llvm::Value>
                     ((Value *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  llvm::BinaryOperator::getOperand
            ((BinaryOperator *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (uint)((ulong)in_RDI >> 0x20));
  pCVar3 = llvm::dyn_cast<llvm::ConstantInt,llvm::Value>
                     ((Value *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  BVar1 = llvm::BinaryOperator::getOpcode((BinaryOperator *)0x1ceefb);
  solveEquality((RelationsAnalyzer *)CONCAT44(BVar1,in_stack_ffffffffffffffd0),in_RDI,
                (BinaryOperator *)0x1cef12);
  if ((BVar1 == Add) || (BVar1 == Mul)) {
    solveCommutativity((RelationsAnalyzer *)CONCAT44(BVar1,in_stack_ffffffffffffffd0),in_RDI,
                       (BinaryOperator *)0x1cef33);
  }
  if ((BVar1 != Mul) && ((pCVar2 == (ret_type)0x0 || (pCVar3 == (ret_type)0x0)))) {
    if ((pCVar2 == (ret_type)0x0) && (pCVar3 == (ret_type)0x0)) {
      solveNonConstants(in_RSI,opcode_00,(BinaryOperator *)0x0);
    }
    else {
      solveDifferent(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
    }
  }
  return;
}

Assistant:

void RelationsAnalyzer::opGen(ValueRelations &graph,
                              const llvm::BinaryOperator *op) {
    const auto *c1 = llvm::dyn_cast<llvm::ConstantInt>(op->getOperand(0));
    const auto *c2 = llvm::dyn_cast<llvm::ConstantInt>(op->getOperand(1));
    auto opcode = op->getOpcode();

    solveEquality(graph, op);
    if (opcode == llvm::Instruction::Add || opcode == llvm::Instruction::Mul)
        solveCommutativity(graph, op);

    if (opcode == llvm::Instruction::Mul)
        return;

    if (c1 && c2)
        return;

    if (!c1 && !c2)
        return solveNonConstants(graph, opcode, op);

    solveDifferent(graph, op);
}